

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O1

void __thiscall
TPZHCurlEquationFilter<double>::ChooseVertexAndEdge
          (TPZHCurlEquationFilter<double> *this,int64_t *treatVertex,int64_t *remEdge)

{
  map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TPZHCurlEquationFilter<double> *pTVar5;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *this_01;
  int64_t *__k;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *this_02;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *p_Var10;
  _Base_ptr p_Var11;
  int iVar12;
  const_iterator __position;
  long lVar13;
  map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
  *this_03;
  pair<std::_Rb_tree_iterator<long>,_std::_Rb_tree_iterator<long>_> pVar14;
  long ibase;
  int64_t base_node;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *__range1;
  int64_t ibase_free;
  long local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  key_type_conflict1 local_90;
  key_type_conflict1 local_88;
  TPZHCurlEquationFilter<double> *local_80;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *local_78;
  map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
  *local_70;
  int64_t *local_68;
  int64_t *local_60;
  map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
  *local_58;
  _Rb_tree_node_base *local_50;
  _Rb_tree_node_base *local_48;
  _Rb_tree_node_base *local_40;
  long local_38;
  
  local_78 = &this->freeEdgesToTreatedNodes;
  local_98 = (_Base_ptr)&this->field_0xa0;
  local_a0 = *(_Base_ptr *)&this->field_0xb0;
  local_80 = this;
  local_68 = remEdge;
  local_60 = treatVertex;
  if (local_a0 != local_98) {
    local_58 = &this->mVertex;
    this_03 = &this->mEdge;
    local_70 = this_03;
    bVar2 = false;
    do {
      bVar4 = bVar2;
      if (!bVar2) {
        p_Var8 = *(_Rb_tree_node_base **)(local_a0 + 2);
        local_50 = (_Rb_tree_node_base *)&local_a0[1]._M_left;
        bVar3 = bVar2;
        if (p_Var8 != local_50) {
          do {
            local_90 = *(key_type_conflict1 *)(p_Var8 + 1);
            local_48 = p_Var8;
            bVar4 = bVar3;
            if (!bVar3) {
              pmVar6 = std::
                       map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                       ::operator[](local_58,&local_90);
              p_Var9 = (pmVar6->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              local_40 = &(pmVar6->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header;
              if (p_Var9 != local_40) {
                do {
                  lVar13 = (long)(int)p_Var9[1]._M_color;
                  local_a8 = lVar13;
                  pmVar7 = std::
                           map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                           ::operator[](this_03,&local_a8);
                  iVar12 = 7;
                  if ((pmVar7->status == EFreeEdge) && (iVar12 = 6, !bVar4)) {
                    local_a8 = lVar13;
                    pmVar7 = std::
                             map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                             ::operator[](this_03,&local_a8);
                    iVar12 = 0;
                    p_Var8 = (pmVar7->vertex_connect)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left;
                    while ((_Rb_tree_header *)p_Var8 !=
                           &(pmVar7->vertex_connect)._M_t._M_impl.super__Rb_tree_header) {
                      _Var1 = p_Var8[1]._M_color;
                      local_a8 = (long)(int)_Var1;
                      pmVar6 = std::
                               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                               ::operator[](local_58,&local_a8);
                      if (pmVar6->status != ETreatedVertex) {
                        local_88 = local_90;
                        *local_68 = lVar13;
                        *local_60 = (long)(int)_Var1;
                        local_38 = *(long *)(local_a0 + 1);
                        bVar4 = true;
                        this_03 = local_70;
                        break;
                      }
                      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
                      this_03 = local_70;
                    }
                  }
                } while (((iVar12 == 7) || (iVar12 == 0)) &&
                        (p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9), p_Var9 != local_40));
              }
            }
          } while ((!bVar3) &&
                  (p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48), bVar3 = bVar4,
                  p_Var8 != local_50));
        }
      }
    } while ((!bVar2) &&
            (local_a0 = (_Base_ptr)std::_Rb_tree_increment(local_a0), bVar2 = bVar4,
            local_a0 != local_98));
  }
  pTVar5 = local_80;
  this_00 = &local_80->mVertex;
  pmVar6 = std::
           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
           ::operator[](this_00,&local_88);
  __k = local_60;
  pmVar6->free_edges = pmVar6->free_edges + -1;
  pmVar6 = std::
           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
           ::operator[](this_00,local_60);
  pmVar6->free_edges = pmVar6->free_edges + -1;
  pmVar7 = std::
           map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
           ::operator[](&pTVar5->mEdge,local_68);
  this_01 = local_78;
  pmVar7->status = ERemovedEdge;
  this_02 = &std::
             map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
             ::operator[](local_78,&local_38)->_M_t;
  pVar14 = std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
           equal_range(this_02,&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_erase_aux(this_02,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  local_90 = local_38 + -1;
  p_Var10 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
            std::
            map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
            ::operator[](this_01,&local_90);
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>(p_Var10,&local_88);
  pmVar6 = std::
           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
           ::operator[](this_00,__k);
  p_Var10 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
            std::
            map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
            ::operator[](this_01,&pmVar6->free_edges);
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>(p_Var10,__k);
  __position._M_node = *(_Base_ptr *)&pTVar5->field_0xb0;
  if (__position._M_node != local_98) {
    do {
      p_Var9 = __position._M_node[2]._M_left;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      if (p_Var9 == (_Base_ptr)0x0) {
        std::
        _Rb_tree<long,_std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<long,_std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                        *)local_78,__position);
      }
      __position._M_node = p_Var11;
    } while (p_Var11 != local_98);
  }
  return;
}

Assistant:

void TPZHCurlEquationFilter<TVar>::ChooseVertexAndEdge(int64_t &treatVertex, int64_t &remEdge)
{
    
    // The treated node must be connected to an already treated node by a free edge
    // Thus, we take a treated node and then a free edge and its 
    // corresponding second node to be the treated one
    auto highest = freeEdgesToTreatedNodes.rbegin()->first; // highest number of free edges
    int64_t base_node;
    int64_t ibase_free;
    bool flag = false;
    // We look at all the treated nodes, starting from the one with the highest number of free edges
    for (const auto& free_edges : freeEdgesToTreatedNodes){
        if (flag) break;
        // We loop over each treated vertex with the maximum value of free edges (called basis node) 
        for (auto ibase : free_edges.second){       
            if (flag) break;
            // We loop over each edge connected to the basis node
            for (auto iedge : mVertex[ibase].edge_connect){
                if (mEdge[iedge].status != EFreeEdge) continue; // only free edges can be removed
                if (flag) break;
                // For each edge connected to the basis node, check if the complementary 
                // node has been treated before (to avoid choosing the same treatedNode more than once)
                for (auto inode : mEdge[iedge].vertex_connect){
                    if (mVertex[inode].status == ETreatedVertex) {
                        //The complementary node has been tretated, go to the next one
                        continue;
                    }
                    // The node was not treated before, then it is the chosen one.
                    // Thus fill the variables with the proper values
                    base_node = ibase;
                    remEdge = iedge;
                    treatVertex = inode;
                    ibase_free = free_edges.first;
                    
                    flag = true;
                    break;
                }
            }
        }
    }

    mVertex[base_node].free_edges--;
    mVertex[treatVertex].free_edges--;
    mEdge[remEdge].status = ERemovedEdge;
    
    //Update the data structure.
    //Delete node and realocate the base node
    freeEdgesToTreatedNodes[ibase_free].erase(base_node);
    freeEdgesToTreatedNodes[ibase_free-1].insert(base_node);
    //Insert treatVertex
    freeEdgesToTreatedNodes[mVertex[treatVertex].free_edges].insert(treatVertex);

    //Clears the freeEdgesToTreatedNodes with 0 nodes in some free edges - to avoid a bug when looping std::map
    for (auto it = freeEdgesToTreatedNodes.cbegin(); it != freeEdgesToTreatedNodes.cend();) {
        if (it->second.size() == 0) {
            freeEdgesToTreatedNodes.erase(it++);
        } else {
            ++it;
        }
    }//it
}